

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::CompletePreviousAllocation
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,TEmitBufferAllocation *allocation)

{
  AutoRealOrFakeCriticalSection<CriticalSection> local_18;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  
  local_18.cs = &this->criticalSection;
  CCLock::Enter(&(local_18.cs)->super_CCLock);
  if (allocation != (TEmitBufferAllocation *)0x0) {
    allocation->bytesUsed = allocation->bytesCommitted;
  }
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_18);
  return;
}

Assistant:

void
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CompletePreviousAllocation(TEmitBufferAllocation* allocation)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);
    if (allocation != nullptr)
    {
        allocation->bytesUsed = allocation->bytesCommitted;
    }
}